

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall despot::BaseTag::ReadConfig(BaseTag *this,istream *is)

{
  Floor *pFVar1;
  pointer pCVar2;
  pointer pCVar3;
  int iVar4;
  int iVar5;
  istream *piVar6;
  istream *piVar7;
  BaseTag *this_00;
  long lVar8;
  int w;
  int h;
  int o;
  string line;
  string val;
  string key;
  istringstream iss;
  int local_250;
  int local_24c;
  BaseTag *local_248;
  undefined1 local_23c [4];
  string local_238;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  Coord local_1f8 [8];
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  Floor local_1b0;
  ios_base local_138 [264];
  
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = 0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1f0 = local_1e0;
  local_1e8._0_4_ = 0;
  local_1e8._4_4_ = 0;
  local_1e0[0] = 0;
  pFVar1 = &this->floor_;
  local_248 = this;
  while( true ) {
    piVar6 = std::operator>>(is,(string *)&local_1d0);
    piVar6 = std::operator>>(piVar6,(string *)&local_1f0);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    iVar4 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar4 == 0) {
      piVar7 = (istream *)std::istream::operator>>((istream *)is,&local_24c);
      std::istream::operator>>(piVar7,&local_250);
      despot::Floor::Floor(&local_1b0,local_24c,local_250);
      pFVar1->num_rows_ = local_1b0.num_rows_;
      pFVar1->num_cols_ = local_1b0.num_cols_;
      (this->floor_).floor_ = local_1b0.floor_;
      pCVar2 = (local_248->floor_).cells_.
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar3 = (local_248->floor_).cells_.
               super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (local_248->floor_).cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (local_248->floor_).cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (local_248->floor_).cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pCVar2 != (pointer)0x0) {
        operator_delete(pCVar2,(long)pCVar3 - (long)pCVar2);
      }
      local_238.field_2._M_allocated_capacity =
           (size_type)
           (local_248->floor_).dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_248->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_238._M_dataplus._M_p =
           (pointer)(local_248->floor_).dist_.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_238._M_string_length =
           (size_type)
           (local_248->floor_).dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_248->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_248->floor_).dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1b0.dist_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b0.dist_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_238);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_1b0.dist_);
      if (local_1b0.cells_.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b0.cells_.
                        super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b0.cells_.
                              super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b0.cells_.
                              super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (0 < local_24c) {
        iVar4 = 0;
        do {
          std::operator>>(is,(string *)&local_218);
          if (0 < local_250) {
            lVar8 = 0;
            iVar5 = local_250;
            do {
              if (local_218[lVar8] != '#') {
                despot::Coord::Coord(local_1f8,(int)lVar8,iVar4);
                despot::Floor::AddCell(pFVar1,local_1f8);
                iVar5 = local_250;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar5);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_24c);
      }
      despot::Floor::ComputeDistances();
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_1d0);
      if (iVar4 == 0) {
        piVar7 = (istream *)std::istream::operator>>((istream *)is,&local_24c);
        piVar7 = (istream *)std::istream::operator>>(piVar7,&local_250);
        this_00 = (BaseTag *)local_23c;
        std::istream::operator>>(piVar7,(int *)this_00);
        RandomMap_abi_cxx11_(&local_238,this_00,local_24c,local_250,(int)local_23c);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_1b0,(string *)&local_238,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        ReadConfig(local_248,(istream *)&local_1b0);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
        std::ios_base::~ios_base(local_138);
      }
    }
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,CONCAT71(local_1e0._1_7_,local_1e0[0]) + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,CONCAT71(local_1c0._1_7_,local_1c0[0]) + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,CONCAT71(local_208._1_7_,local_208[0]) + 1);
  }
  return;
}

Assistant:

void BaseTag::ReadConfig(istream& is) {
	string line, key, val;
	while (is >> key >> val) {
		if (key == "mapSize") {
			int nrows, ncols;
			is >> nrows >> ncols;
			floor_ = Floor(nrows, ncols);

			for (int y = 0; y < nrows; y++) {
				is >> line;
				for (int x = 0; x < ncols; x++) {
					if (line[x] != '#') {
						floor_.AddCell(Coord(x, y));
					}
				}
			}

			floor_.ComputeDistances();
		} else if (key == "width-height-obstacles") {
			int h, w, o;
			is >> h >> w >> o;
			istringstream iss(RandomMap(h, w, o));
			ReadConfig(iss);
		}
	}
}